

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O3

void __thiscall CDevice::CDevice(CDevice *this,char *name,CDevice *parent)

{
  char *pcVar1;
  
  this->Memory = (byte *)0x0;
  this->ZxRamTop = 0;
  this->CurrentSlot = 0;
  this->Next = (CDevice *)0x0;
  this->SlotsCount = 0;
  this->PagesCount = 0;
  this->previousSlotI = 0;
  this->previousSlotOpt = O_NONE;
  this->limitExceeded = false;
  pcVar1 = strdup(name);
  this->ID = pcVar1;
  if (parent != (CDevice *)0x0) {
    parent->Next = this;
  }
  memset(this->Slots,0,0x2800);
  return;
}

Assistant:

CDevice::CDevice(const char *name, CDevice *parent)
	: Next(nullptr), SlotsCount(0), PagesCount(0), Memory(nullptr), ZxRamTop(0), CurrentSlot(0),
	previousSlotI(0), previousSlotOpt(CDeviceSlot::ESlotOptions::O_NONE), limitExceeded(false) {
	ID = STRDUP(name);
	if (parent) parent->Next = this;
	for (auto & slot : Slots) slot = nullptr;
	for (auto & page : Pages) page = nullptr;
}